

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftRoll.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     ror<unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_char> destination,uint8_t count,Context *context)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int temp_count;
  Context *context_local;
  uint8_t count_local;
  modify_t<unsigned_char> destination_local;
  
  iVar5 = Numeric::bit_size<unsigned_char>();
  uVar6 = (uint)count & iVar5 - 1U;
  if (count != '\0') {
    if (uVar6 != 0) {
      bVar1 = *destination;
      bVar3 = (byte)uVar6;
      uVar2 = *destination;
      iVar5 = Numeric::bit_size<unsigned_char>();
      *destination = (byte)((int)(uint)bVar1 >> (bVar3 & 0x1f)) |
                     uVar2 << ((char)iVar5 - bVar3 & 0x1f);
    }
    bVar1 = *destination;
    bVar3 = Numeric::top_bit<unsigned_char>();
    Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,(uint)(bVar1 & bVar3));
    bVar1 = *destination;
    bVar3 = *destination;
    bVar4 = Numeric::top_bit<unsigned_char>();
    Flags::set_from<(InstructionSet::x86::Flag)3>
              (&context->flags,((uint)bVar1 ^ (uint)bVar3 << 1) & (uint)bVar4);
  }
  return;
}

Assistant:

void ror(
	modify_t<IntT> destination,
	uint8_t count,
	ContextT &context
) {
	/*
		(* ROL and ROR instructions *)
		SIZE ← OperandSize
		CASE (determine count) OF
			SIZE = 8:	tempCOUNT ← COUNT MOD 8;
			SIZE = 16:	tempCOUNT ← COUNT MOD 16;
			SIZE = 32:	tempCOUNT ← COUNT MOD 32;
		ESAC;
	*/
	/*
		(* ROR instruction operation *)
		WHILE (tempCOUNT ≠ 0)
			DO
				tempCF ← LSB(DEST);
				DEST ← (DEST / 2) + (tempCF * 2^SIZE);
				tempCOUNT ← tempCOUNT – 1;
			OD;
		ELIHW;
		IF COUNT = 1
			THEN OF ← MSB(DEST) XOR MSB - 1 (DEST);
			ELSE OF is undefined;
		FI;
	*/
	/*
		The CF flag contains the value of the bit shifted into it.
		The OF flag is affected only for single- bit rotates (see “Description” above);
		it is undefined for multi-bit rotates. The SF, ZF, AF, and PF flags are not affected.
	*/
	const auto temp_count = count & (Numeric::bit_size<IntT>() - 1);
	if(!count) {
		// TODO: is this 8086-specific? i.e. do the other x86s also exit without affecting flags when temp_count = 0?
		return;
	}
	if(temp_count) {
		destination = IntT(
			(destination >> temp_count) |
			(destination << (Numeric::bit_size<IntT>() - temp_count))
		);
	}

	context.flags.template set_from<Flag::Carry>(destination & Numeric::top_bit<IntT>());
	context.flags.template set_from<Flag::Overflow>(
		(destination ^ (destination << 1)) & Numeric::top_bit<IntT>()
	);
}